

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::Tables::FindFile(Tables *this,string_view key)

{
  char *pcVar1;
  DescriptorsByNameSet<FileDescriptor> *this_00;
  ctrl_t *pcVar2;
  long lVar3;
  undefined1 *puVar4;
  anon_union_8_1_a8a14541_for_iterator_2 *paVar5;
  pointer __s1;
  uint uVar6;
  size_t sVar7;
  bool bVar8;
  ushort uVar9;
  int iVar10;
  uint64_t uVar11;
  slot_type *ppFVar12;
  FileDescriptor *pFVar13;
  reference ppFVar14;
  slot_type *ppFVar15;
  Tables *pTVar16;
  ulong uVar17;
  undefined1 uVar18;
  uint uVar19;
  ulong uVar20;
  size_type __rlen_1;
  ulong uVar21;
  size_type __rlen;
  undefined1 *puVar22;
  anon_union_8_1_a8a14541_for_iterator_2 unaff_R13;
  uchar *bytes_1;
  uint64_t v;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  iterator iVar25;
  const_iterator it;
  __m128i match;
  ulong local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  Tables *local_90;
  ulong local_88;
  iterator local_80;
  ctrl_t *local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ctrl_t local_58;
  ctrl_t cStack_57;
  ctrl_t cStack_56;
  ctrl_t cStack_55;
  ctrl_t cStack_54;
  ctrl_t cStack_53;
  ctrl_t cStack_52;
  ctrl_t cStack_51;
  ctrl_t cStack_50;
  ctrl_t cStack_4f;
  ctrl_t cStack_4e;
  ctrl_t cStack_4d;
  ctrl_t cStack_4c;
  ctrl_t cStack_4b;
  ctrl_t cStack_4a;
  ctrl_t cStack_49;
  iterator local_40;
  
  local_a0._M_str = key._M_str;
  local_a0._M_len = key._M_len;
  this_00 = &this->files_by_name_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  sVar7 = local_a0._M_len;
  puVar22 = (undefined1 *)this;
  if (1 < (this->files_by_name_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    uVar11 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                       (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,local_a0._M_str,
                        local_a0._M_len);
    uVar20 = uVar11 ^ sVar7;
    uVar21 = (this_00->
             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ).settings_.
             super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
             .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
             capacity_;
    puVar22 = (undefined1 *)this;
    if (uVar21 == 1) {
      ppFVar15 = absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 ::soo_slot(&this_00->
                             super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           );
      ppFVar12 = ((anon_union_8_1_a8a14541_for_iterator_2 *)(*ppFVar15)->name_)[1].slot_;
      if ((ppFVar12 == (slot_type *)local_a0._M_len) &&
         (((unaff_R13 = (anon_union_8_1_a8a14541_for_iterator_2)
                        ((anon_union_8_1_a8a14541_for_iterator_2 *)(*ppFVar15)->name_)->slot_,
           ppFVar12 == (slot_type *)0x0 ||
           (iVar10 = bcmp(unaff_R13.slot_,local_a0._M_str,(size_t)ppFVar12), iVar10 == 0)) &&
          (uVar11 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                              (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                               unaff_R13.slot_,ppFVar12), uVar20 != (uVar11 ^ (ulong)ppFVar12))))) {
LAB_0017cf10:
        __assert_fail("(!is_key_equal || is_hash_equal) && \"eq(k1, k2) must imply that hash(k1) == hash(k2). \" \"hash/eq functors are inconsistent.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xfbf,
                      "auto absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::AssertHashEqConsistent(const std::basic_string_view<char> &)::(anonymous class)::operator()(const ctrl_t *, slot_type *) const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                     );
      }
    }
    else {
      if (uVar21 == 0) goto LAB_0017d068;
      if (uVar21 < 0x11) {
        ppFVar12 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ::slot_array(&this_00->
                                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               );
        uVar21 = (this->files_by_name_).
                 super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 .settings_.
                 super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                 .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                 value.capacity_;
        unaff_R13 = (anon_union_8_1_a8a14541_for_iterator_2)
                    ((anon_union_8_1_a8a14541_for_iterator_2 *)
                    &(this->files_by_name_).
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     .settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.heap_or_soo_)->slot_;
        if (uVar21 < 0xf) {
          if (8 < uVar21) {
            __assert_fail("(cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x78b,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FileDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
          uVar21 = *(ulong *)((long)unaff_R13.slot_ + uVar21) & 0x8080808080808080;
          if (uVar21 != 0x8080808080808080) {
            uVar21 = uVar21 ^ 0x8080808080808080;
            do {
              lVar3 = 0;
              if (uVar21 != 0) {
                for (; (uVar21 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
                }
              }
              paVar5 = *(anon_union_8_1_a8a14541_for_iterator_2 **)
                        (*(long *)((long)ppFVar12 + ((ulong)((uint)lVar3 & 0xfffffff8) - 8)) + 8);
              ppFVar15 = paVar5[1].slot_;
              if (((ppFVar15 == (slot_type *)local_a0._M_len) &&
                  ((unaff_R13 = (anon_union_8_1_a8a14541_for_iterator_2)paVar5->slot_,
                   ppFVar15 == (slot_type *)0x0 ||
                   (iVar10 = bcmp(unaff_R13.slot_,local_a0._M_str,(size_t)ppFVar15), iVar10 == 0))))
                 && (uVar11 = absl::lts_20250127::hash_internal::MixingHashState::
                              CombineContiguousImpl
                                        (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                                         unaff_R13.slot_,ppFVar15),
                    uVar20 != (uVar11 ^ (ulong)ppFVar15))) goto LAB_0017cf10;
              uVar21 = uVar21 & uVar21 - 1;
            } while (uVar21 != 0);
          }
        }
        else {
          uVar21 = (this->files_by_name_).
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   .settings_.
                   super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                   .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
                   value.size_;
          uVar17 = uVar21 >> 1;
          local_90 = this;
          local_88 = uVar17;
          if (1 < uVar21) {
            while( true ) {
              auVar23 = *(undefined1 (*) [16])unaff_R13.slot_;
              uVar19 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(byte)(auVar23[0xf] >> 7) << 0xf);
              if (uVar19 != 0xffff) {
                uVar19 = ~uVar19;
                do {
                  uVar6 = 0;
                  if (uVar19 != 0) {
                    for (; (uVar19 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  if (*(char *)((long)unaff_R13.slot_ + (ulong)uVar6) < '\0') {
                    __assert_fail("(IsFull(ctrl[i]) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                  ,0x79d,
                                  "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FileDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                                 );
                  }
                  ppFVar15 = (slot_type *)ppFVar12[uVar6]->name_->_M_string_length;
                  if (((ppFVar15 == (slot_type *)local_a0._M_len) &&
                      ((__s1 = (ppFVar12[uVar6]->name_->_M_dataplus)._M_p,
                       ppFVar15 == (slot_type *)0x0 ||
                       (iVar10 = bcmp(__s1,local_a0._M_str,(size_t)ppFVar15), iVar10 == 0)))) &&
                     (uVar11 = absl::lts_20250127::hash_internal::MixingHashState::
                               CombineContiguousImpl
                                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed
                                          ,__s1,ppFVar15), uVar20 != (uVar11 ^ (ulong)ppFVar15)))
                  goto LAB_0017cf10;
                  uVar17 = uVar17 - 1;
                  uVar9 = (ushort)(uVar19 - 1) & (ushort)uVar19;
                  uVar19 = CONCAT22((short)(uVar19 - 1 >> 0x10),uVar9);
                } while (uVar9 != 0);
              }
              if (uVar17 == 0) break;
              ppFVar12 = ppFVar12 + 0x10;
              pcVar1 = (char *)((long)unaff_R13.slot_ + 0xf);
              unaff_R13.slot_ = unaff_R13.slot_ + 2;
              if (*pcVar1 == -1) {
                __assert_fail("((remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                              ,0x7a5,
                              "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FileDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                             );
              }
            }
          }
          puVar22 = (undefined1 *)local_90;
          if (local_88 <
              (local_90->files_by_name_).
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              .settings_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
              .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value
              .size_ >> 1) {
            __assert_fail("(original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7aa,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::FileDescriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h:4019:36)]"
                         );
          }
        }
      }
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  lVar3 = (this_00->
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ).settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          capacity_;
  if (lVar3 != 1) {
    if (lVar3 != 0) {
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      ::prefetch_heap_block
                (&this_00->
                  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                );
      sVar7 = local_a0._M_len;
      uVar11 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                         (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,local_a0._M_str
                          ,local_a0._M_len);
      uVar21 = (this_00->
               super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ).settings_.
               super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
               .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.
               value.capacity_;
      if (uVar21 == 1) {
        __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe2a,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = std::basic_string_view<char>]"
                     );
      }
      if (uVar21 != 0) {
        if ((uVar21 + 1 & uVar21) != 0) {
          __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x14c,
                        "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar20 = (uVar11 ^ sVar7) * -0x234dd359734ecb13;
        local_b0 = ((uVar20 >> 0x38 | (uVar20 & 0xff000000000000) >> 0x28 |
                     (uVar20 & 0xff0000000000) >> 0x18 | (uVar20 & 0xff00000000) >> 8 |
                     (uVar20 & 0xff000000) << 8 | (uVar20 & 0xff0000) << 0x18 |
                     (uVar20 & 0xff00) << 0x28 | uVar20 << 0x38) >> 7 ^
                   (ulong)(((Tables *)puVar22)->files_by_name_).
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                          .settings_.
                          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                          .value.heap_or_soo_.heap.control >> 0xc) & uVar21;
        local_88 = uVar21;
        local_70 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   ::control(&this_00->
                              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                            );
        uVar18 = (undefined1)(uVar20 >> 0x38);
        auVar23 = ZEXT216(CONCAT11(uVar18,uVar18) & 0x7f7f);
        auVar23 = pshuflw(auVar23,auVar23,0);
        local_68 = auVar23._0_4_;
        pTVar16 = (Tables *)0x0;
        uStack_64 = local_68;
        uStack_60 = local_68;
        uStack_5c = local_68;
        do {
          iVar25.field_1.slot_ = unaff_R13.slot_;
          iVar25.ctrl_ = puVar22;
          pcVar2 = local_70 + local_b0;
          local_58 = *pcVar2;
          cStack_57 = pcVar2[1];
          cStack_56 = pcVar2[2];
          cStack_55 = pcVar2[3];
          cStack_54 = pcVar2[4];
          cStack_53 = pcVar2[5];
          cStack_52 = pcVar2[6];
          cStack_51 = pcVar2[7];
          cStack_50 = pcVar2[8];
          cStack_4f = pcVar2[9];
          cStack_4e = pcVar2[10];
          cStack_4d = pcVar2[0xb];
          cStack_4c = pcVar2[0xc];
          cStack_4b = pcVar2[0xd];
          cStack_4a = pcVar2[0xe];
          cStack_49 = pcVar2[0xf];
          auVar23[0] = -((ctrl_t)local_68 == local_58);
          auVar23[1] = -(local_68._1_1_ == cStack_57);
          auVar23[2] = -(local_68._2_1_ == cStack_56);
          auVar23[3] = -(local_68._3_1_ == cStack_55);
          auVar23[4] = -((ctrl_t)uStack_64 == cStack_54);
          auVar23[5] = -(uStack_64._1_1_ == cStack_53);
          auVar23[6] = -(uStack_64._2_1_ == cStack_52);
          auVar23[7] = -(uStack_64._3_1_ == cStack_51);
          auVar23[8] = -((ctrl_t)uStack_60 == cStack_50);
          auVar23[9] = -(uStack_60._1_1_ == cStack_4f);
          auVar23[10] = -(uStack_60._2_1_ == cStack_4e);
          auVar23[0xb] = -(uStack_60._3_1_ == cStack_4d);
          auVar23[0xc] = -((ctrl_t)uStack_5c == cStack_4c);
          auVar23[0xd] = -(uStack_5c._1_1_ == cStack_4b);
          auVar23[0xe] = -(uStack_5c._2_1_ == cStack_4a);
          auVar23[0xf] = -(uStack_5c._3_1_ == cStack_49);
          uVar9 = (ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar23[0xf] >> 7) << 0xf;
          uVar19 = (uint)uVar9;
          local_90 = pTVar16;
          while (uVar9 != 0) {
            uVar6 = 0;
            if (uVar19 != 0) {
              for (; (uVar19 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
              }
            }
            local_80.ctrl_ = (ctrl_t *)&local_a0;
            local_80.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)this_00;
            ppFVar12 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ::slot_array(&this_00->
                                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   );
            uVar21 = uVar6 + local_b0 & local_88;
            bVar8 = absl::lts_20250127::container_internal::
                    hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,void>
                    ::
                    apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FileDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>>
                              ((EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_>
                                *)&local_80,ppFVar12 + uVar21);
            if (bVar8) {
              iVar25 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ::iterator_at(&this_00->
                                      super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                     ,uVar21);
              break;
            }
            uVar9 = (ushort)(uVar19 - 1) & (ushort)uVar19;
            uVar19 = CONCAT22((short)(uVar19 - 1 >> 0x10),uVar9);
          }
          unaff_R13 = iVar25.field_1;
          puVar22 = iVar25.ctrl_;
          if (uVar9 != 0) {
LAB_0017ccb9:
            bVar8 = false;
            pTVar16 = local_90;
          }
          else {
            auVar24[0] = -(local_58 == kEmpty);
            auVar24[1] = -(cStack_57 == kEmpty);
            auVar24[2] = -(cStack_56 == kEmpty);
            auVar24[3] = -(cStack_55 == kEmpty);
            auVar24[4] = -(cStack_54 == kEmpty);
            auVar24[5] = -(cStack_53 == kEmpty);
            auVar24[6] = -(cStack_52 == kEmpty);
            auVar24[7] = -(cStack_51 == kEmpty);
            auVar24[8] = -(cStack_50 == kEmpty);
            auVar24[9] = -(cStack_4f == kEmpty);
            auVar24[10] = -(cStack_4e == kEmpty);
            auVar24[0xb] = -(cStack_4d == kEmpty);
            auVar24[0xc] = -(cStack_4c == kEmpty);
            auVar24[0xd] = -(cStack_4b == kEmpty);
            auVar24[0xe] = -(cStack_4a == kEmpty);
            auVar24[0xf] = -(cStack_49 == kEmpty);
            if ((((((((((((((((auVar24 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar24 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar24 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar24 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar24 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar24 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar24 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar24 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar24 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar24 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar24 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar24 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                cStack_49 == kEmpty) {
              absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              ::AssertNotDebugCapacity
                        (&this_00->
                          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        );
              puVar22 = (undefined1 *)0x0;
              goto LAB_0017ccb9;
            }
            puVar4 = (undefined1 *)
                     (this_00->
                     super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     ).settings_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>
                     .value.capacity_;
            if (puVar4 == (undefined1 *)0x0) goto LAB_0017d068;
            pTVar16 = (Tables *)
                      &(local_90->pending_files_).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (puVar4 < pTVar16) {
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe37,
                            "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>, K = std::basic_string_view<char>]"
                           );
            }
            local_b0 = (long)&(local_90->pending_files_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + local_b0 &
                       local_88;
            bVar8 = true;
          }
        } while (bVar8);
        goto LAB_0017ce63;
      }
    }
LAB_0017d068:
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, std::allocator<const google::protobuf::FileDescriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::FileDescriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>, Alloc = std::allocator<const google::protobuf::FileDescriptor *>]"
                 );
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  if (1 < (((Tables *)puVar22)->files_by_name_).
          super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          .settings_.
          super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
          .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
          size_) {
    local_80.ctrl_ = (ctrl_t *)&local_a0;
    local_80.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)this_00;
    ppFVar12 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::soo_slot(&this_00->
                           super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                         );
    bVar8 = absl::lts_20250127::container_internal::
            hash_policy_traits<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,void>
            ::
            apply<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,std::allocator<google::protobuf::FileDescriptor_const*>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FileDescriptor_const*&,absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::FileDescriptor_const*>>
                      ((EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                       &local_80,ppFVar12);
    if (bVar8) {
      unaff_R13.slot_ =
           absl::lts_20250127::container_internal::
           raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
           ::soo_slot(&this_00->
                       super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     );
      puVar22 = absl::lts_20250127::container_internal::kSooControl;
      goto LAB_0017ce63;
    }
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  puVar22 = (undefined1 *)0x0;
LAB_0017ce63:
  local_80.ctrl_ = puVar22;
  local_80.field_1 = unaff_R13;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::AssertNotDebugCapacity
            (&this_00->
              super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            );
  local_40.ctrl_ = (ctrl_t *)0x0;
  bVar8 = absl::lts_20250127::container_internal::operator==(&local_80,&local_40);
  if (bVar8) {
    pFVar13 = (FileDescriptor *)0x0;
  }
  else {
    ppFVar14 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::FileDescriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::FileDescriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::FileDescriptor>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               ::iterator::operator*(&local_80);
    pFVar13 = *ppFVar14;
  }
  return pFVar13;
}

Assistant:

inline const FileDescriptor* DescriptorPool::Tables::FindFile(
    absl::string_view key) const {
  auto it = files_by_name_.find(key);
  if (it == files_by_name_.end()) return nullptr;
  return *it;
}